

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O3

int find_insn_pattern(gen_ctx_t gen_ctx,MIR_insn_t insn,int *size)

{
  longdouble lVar1;
  int iVar2;
  VARR_insn_pattern_info_t *pVVar3;
  insn_pattern_info_t iVar4;
  VARR_int *pVVar5;
  VARR_uint8_t *pVVar6;
  float fVar7;
  size_t sVar8;
  byte *pbVar9;
  size_t sVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  MIR_reg_t MVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  MIR_op_t *op;
  ulong uVar20;
  char *__assertion;
  byte *pbVar21;
  byte *pbVar22;
  bool bVar23;
  bool bVar24;
  byte bVar25;
  double local_48;
  
  pVVar3 = gen_ctx->target_ctx->insn_pattern_info;
  if (((pVVar3 == (VARR_insn_pattern_info_t *)0x0) || (pVVar3->varr == (insn_pattern_info_t *)0x0))
     || (pVVar3->els_num <= (ulong)*(uint *)&insn->field_0x18)) {
    find_insn_pattern_cold_3();
LAB_0016a93d:
    find_insn_pattern_cold_2();
LAB_0016a942:
    __assert_fail("(res >> 60) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x744,"uint64_t read_dec(const char **)");
  }
  iVar4 = pVVar3->varr[*(uint *)&insn->field_0x18];
  if (iVar4.num < 1) {
    return -1;
  }
  uVar20 = 0;
LAB_0016a254:
  pVVar5 = gen_ctx->target_ctx->pattern_indexes;
  if (((pVVar5 != (VARR_int *)0x0) && (pVVar5->varr != (int *)0x0)) &&
     (uVar19 = uVar20 + (long)iVar4.start, uVar19 < pVVar5->els_num)) {
    iVar2 = pVVar5->varr[uVar19];
    sVar8 = MIR_insn_nops(gen_ctx->ctx,insn);
    pbVar9 = (byte *)patterns[iVar2].pattern;
    uVar19 = 0;
    bVar12 = *pbVar9;
joined_r0x0016a2b7:
    if (bVar12 == 0) {
      if (uVar19 != sVar8) {
        __assert_fail("nop == nops",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x831,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
LAB_0016a912:
      if (size == (int *)0x0) {
        return iVar2;
      }
      *size = patterns[iVar2].max_insn_size;
      return iVar2;
    }
    pbVar21 = pbVar9 + 2;
    while ((bVar12 == 9 || (uVar17 = (ulong)bVar12, bVar12 == 0x20))) {
      pbVar22 = pbVar21 + -1;
      pbVar21 = pbVar21 + 1;
      pbVar9 = pbVar9 + 1;
      bVar12 = *pbVar22;
    }
    if (bVar12 == 0x24) goto LAB_0016a912;
    if (sVar8 <= uVar19 && 0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) goto LAB_0016a8dd;
    if (uVar19 == sVar8) {
      __assert_fail("nop < nops",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x788,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    pbVar22 = pbVar21 + -2;
    op = insn->ops + uVar19;
    if (bVar12 < 0x58) {
      if (9 < bVar12 - 0x30) {
        bVar24 = bVar12 == 0x4c;
        goto LAB_0016a69b;
      }
      if (uVar19 <= uVar17 - 0x30) {
        __assert_fail("n < nop",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x80f,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      lVar11 = uVar17 * 0x30;
      bVar12 = *(byte *)((long)insn + lVar11 + -0x8d8);
      lVar1 = *(longdouble *)((long)insn + lVar11 + -0x8d0);
      bVar25 = op->field_0x8;
      local_48 = SUB108(lVar1,0);
      if (bVar25 == 4) {
        bVar25 = 3;
      }
      if (bVar12 == bVar25) {
        MVar15 = *(MIR_reg_t *)((long)insn + lVar11 + -0x8bc);
        fVar7 = SUB104(lVar1,0);
        if ((bVar25 & 0xfe) != 2) {
          switch(bVar25) {
          case 5:
            goto switchD_0016a42b_caseD_5;
          case 6:
            goto switchD_0016a42b_caseD_6;
          case 7:
            goto switchD_0016a42b_caseD_7;
          default:
            __assertion = 
            "mode == MIR_OP_VAR || mode == MIR_OP_INT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE || mode == MIR_OP_VAR_MEM || mode == MIR_OP_LABEL"
            ;
            uVar16 = 0x817;
            goto LAB_0016aa78;
          case 0xb:
            goto switchD_0016a42b_caseD_b;
          case 0xc:
            goto switchD_0016a42b_caseD_3;
          }
        }
        switch(bVar25) {
        case 2:
          bVar24 = (float)(op->u).reg == fVar7;
          goto LAB_0016a8c3;
        case 3:
        case 0xc:
          goto switchD_0016a42b_caseD_3;
        default:
          goto LAB_0016a8c7;
        case 5:
switchD_0016a42b_caseD_5:
          bVar23 = NAN((op->u).f) || NAN(fVar7);
          bVar24 = (op->u).f == fVar7;
          break;
        case 6:
switchD_0016a42b_caseD_6:
          bVar23 = NAN((op->u).d) || NAN(local_48);
          bVar24 = (op->u).d == local_48;
          break;
        case 7:
switchD_0016a42b_caseD_7:
          bVar23 = NAN((op->u).ld) || NAN(lVar1);
          bVar24 = (op->u).ld == lVar1;
          break;
        case 0xb:
switchD_0016a42b_caseD_b:
          if ((((*(char *)&op->u == SUB101(lVar1,0)) &&
               ((op->u).mem.disp == *(long *)((long)insn + lVar11 + -0x8b8))) &&
              ((op->u).mem.base == insn[-0x1c].ops[uVar17 - 1].u.reg)) &&
             ((op->u).mem.index == MVar15)) {
            if (MVar15 == 0xffffffff) goto LAB_0016a8c7;
            bVar24 = (op->u).mem.scale == (MIR_scale_t)((unkuint10)lVar1 >> 8);
            goto LAB_0016a8c3;
          }
          goto LAB_0016a8dd;
        }
        if ((bVar24) && (!bVar23)) goto LAB_0016a8c7;
        goto LAB_0016a8dd;
      }
      if ((bVar12 == 4) && (bVar25 == 3)) {
switchD_0016a42b_caseD_3:
        bVar24 = (double)(op->u).i == local_48;
        goto LAB_0016a8c3;
      }
      goto LAB_0016a8dd;
    }
    switch(bVar12) {
    case 0x68:
      if (op->field_0x8 != '\x02') goto LAB_0016a8dd;
      bVar12 = pbVar21[-1];
      if (9 < (byte)(bVar12 - 0x30)) {
LAB_0016aa20:
        __assert_fail("\'0\' <= ch && ch <= \'9\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x798,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      MVar15 = bVar12 - 0x30;
      pbVar22 = pbVar21 + -1;
      if ((byte)(*pbVar21 - 0x30) < 10) {
        pbVar22 = pbVar21;
        MVar15 = (*pbVar21 - 0x210) + ((uint)bVar12 + (uint)bVar12 * 4) * 2;
      }
      bVar24 = (op->u).reg == MVar15;
      break;
    case 0x69:
      if (((byte)op->field_0x8 < 9) && ((0x118U >> ((byte)op->field_0x8 & 0x1f) & 1) != 0)) {
        bVar12 = pbVar21[-1];
        if ((bVar12 & 0xfc) != 0x30) {
          __assert_fail("\'0\' <= ch && ch <= \'3\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7a9,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        pbVar22 = pbVar21 + -1;
        lVar11 = int_value(gen_ctx,op);
        if (bVar12 == 0x30) {
          lVar18 = (long)(char)lVar11;
        }
        else if (bVar12 == 0x31) {
          lVar18 = (long)(short)lVar11;
        }
        else {
          if (bVar12 != 0x32) goto LAB_0016a8c7;
          lVar18 = (long)(int)lVar11;
        }
        goto LAB_0016a8c0;
      }
      goto LAB_0016a8dd;
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
switchD_0016a34d_caseD_6a:
      __assertion = "0";
      uVar16 = 0x82e;
LAB_0016aa78:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,uVar16,
                    "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
    case 0x6c:
      goto switchD_0016a34d_caseD_6c;
    case 0x6d:
      bVar12 = pbVar21[-1];
      pbVar22 = pbVar21 + -1;
      if (bVar12 < 0x6c) {
        if (bVar12 == 100) {
          bVar25 = 9;
        }
        else {
          if (bVar12 != 0x66) goto LAB_0016a7d3;
          bVar25 = 8;
        }
        bVar12 = 0x13;
LAB_0016a86a:
        bVar14 = 0x13;
      }
      else {
        if (bVar12 != 0x6c) {
          if ((bVar12 == 0x73) || (bVar12 == 0x75)) {
            bVar25 = bVar12 == 0x75;
            bVar24 = bVar12 == 0x73;
            bVar12 = *pbVar21;
            pbVar22 = pbVar21;
          }
          else {
LAB_0016a7d3:
            bVar25 = true;
            bVar24 = true;
          }
          if ((bVar12 & 0xfc) != 0x30) {
            __assert_fail("\'0\' <= ch && ch <= \'3\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x7d8,
                          "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)")
            ;
          }
          bVar13 = bVar24 & bVar25;
          if (bVar12 == 0x32) {
            bVar14 = 4;
            bVar25 = bVar25 | 4;
          }
          else {
            if (bVar12 != 0x31) {
              if (bVar12 == 0x30) {
                bVar14 = 0x13;
                bVar12 = 0x13;
                if (bVar13 != 0) {
                  bVar12 = 0;
                }
              }
              else {
                bVar25 = bVar25 | 6;
                bVar12 = 0x13;
                if (bVar13 != 0) {
                  bVar12 = 6;
                }
                bVar14 = 0xb;
              }
              goto LAB_0016a86c;
            }
            bVar25 = bVar25 | 2;
            bVar14 = 2;
          }
          bVar12 = 0x13;
          if (bVar13 != 0) {
            bVar12 = bVar14;
          }
          goto LAB_0016a86a;
        }
        if (*pbVar21 != 100) {
          __assert_fail("ch == \'d\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7cd,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        bVar25 = 10;
        bVar14 = 0x13;
        if (op->field_0x8 != '\x02') {
          pbVar22 = pbVar21;
          bVar12 = 0x13;
          goto LAB_0016a86a;
        }
        bVar12 = 0x13;
        pbVar22 = pbVar21;
        if (0x21 < (op->u).reg) goto LAB_0016a8c7;
      }
LAB_0016a86c:
      if (((op->field_0x8 != '\v') ||
          (((bVar13 = *(byte *)&op->u, bVar14 != bVar13 && (bVar25 != bVar13)) && (bVar12 != bVar13)
           ))) || (((op->u).mem.index != 0xffffffff &&
                   ((uVar16 = (uint)(op->u).mem.scale, 8 < uVar16 ||
                    ((0x116U >> (uVar16 & 0x1f) & 1) == 0)))))) goto LAB_0016a8dd;
      lVar11 = (op->u).mem.disp;
      lVar18 = (long)(int)lVar11;
LAB_0016a8c0:
      bVar24 = lVar18 == lVar11;
      break;
    case 0x72:
      bVar24 = op->field_0x8 == '\x02';
      break;
    case 0x73:
      if (((ushort)((byte)op->field_0x8 - 3) < 2) && ((op->u).u < 9)) {
        bVar24 = (0x116UL >> ((op->u).u & 0x3f) & 1) != 0;
        goto LAB_0016a636;
      }
      goto LAB_0016a8dd;
    case 0x74:
      if (op->field_0x8 == '\x02') {
        bVar24 = (op->u).reg < 4;
LAB_0016a636:
        if (bVar24) goto LAB_0016a8c7;
      }
      goto LAB_0016a8dd;
    case 0x7a:
      if (1 < (ushort)((byte)op->field_0x8 - 3)) goto LAB_0016a8dd;
      bVar24 = (op->u).i == 0;
      break;
    default:
      if (bVar12 != 99) {
        bVar24 = bVar12 == 0x58;
LAB_0016a69b:
        if (!bVar24) goto switchD_0016a34d_caseD_6a;
        goto LAB_0016a8c7;
      }
      uVar16 = (int)(char)pbVar21[-1] - 0x30;
      if (9 < uVar16) {
        __assert_fail("p != *ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x747,"uint64_t read_dec(const char **)");
      }
      local_48 = 0.0;
      do {
        if ((ulong)local_48 >> 0x3c != 0) goto LAB_0016a942;
        local_48 = (double)((ulong)uVar16 + (long)local_48 * 10);
        pbVar21 = pbVar9 + 2;
        pbVar9 = pbVar9 + 1;
        uVar16 = (int)(char)*pbVar21 - 0x30;
      } while (uVar16 < 10);
      pbVar22 = pbVar9;
      if ((ushort)((byte)op->field_0x8 - 3) < 2) goto switchD_0016a42b_caseD_3;
      goto LAB_0016a8dd;
    }
LAB_0016a8c3:
    if (!bVar24) goto LAB_0016a8dd;
LAB_0016a8c7:
    bVar12 = pbVar22[1];
    uVar19 = uVar19 + 1;
    pbVar9 = pbVar22 + 1;
    goto joined_r0x0016a2b7;
  }
  goto LAB_0016a93d;
switchD_0016a34d_caseD_6c:
  if ((size == (int *)0x0) && (op->field_0x8 == '\f')) {
    sVar10 = get_label_disp(gen_ctx,(MIR_insn_t)(op->u).ref);
    pVVar6 = gen_ctx->target_ctx->result_code;
    if (pVVar6 == (VARR_uint8_t *)0x0) {
      find_insn_pattern_cold_1();
      goto LAB_0016aa20;
    }
    lVar11 = sVar10 - pVVar6->els_num;
    if (lVar11 < 0) {
      lVar11 = (lVar11 - patterns[iVar2].max_insn_size) + -4;
    }
    else {
      lVar11 = lVar11 + -2;
    }
    lVar18 = (long)(char)lVar11;
    goto LAB_0016a8c0;
  }
LAB_0016a8dd:
  uVar20 = uVar20 + 1;
  if (uVar20 == (ulong)iVar4 >> 0x20) {
    return -1;
  }
  goto LAB_0016a254;
}

Assistant:

static int find_insn_pattern (gen_ctx_t gen_ctx, MIR_insn_t insn, int *size) {
  int i, ind;
  const struct pattern *pat;
  insn_pattern_info_t info = VARR_GET (insn_pattern_info_t, insn_pattern_info, insn->code);

  for (i = 0; i < info.num; i++) {
    ind = VARR_GET (int, pattern_indexes, info.start + i);
    pat = &patterns[ind];
    if (pattern_match_p (gen_ctx, pat, insn, size == NULL)) {
      if (size != NULL) *size = patterns[ind].max_insn_size;
      return ind;
    }
  }
  return -1;
}